

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  ctrl_t *pcVar3;
  ctrl_t *pcVar4;
  ctrl_t *pcVar5;
  bool bVar6;
  ctrl_t *pcVar7;
  
  pcVar1 = a->ctrl_;
  if ((pcVar1 == kEmptyGroup + 0x10 || pcVar1 == (ctrl_t *)0x0) || (kSentinel < *pcVar1)) {
    pcVar2 = b->ctrl_;
    if ((pcVar2 != kEmptyGroup + 0x10 && pcVar2 != (ctrl_t *)0x0) && (*pcVar2 < ~kSentinel))
    goto LAB_00e62518;
    if (pcVar1 == kEmptyGroup + 0x10 && pcVar2 == kEmptyGroup + 0x10) {
LAB_00e6250b:
      return pcVar1 == pcVar2;
    }
    if ((pcVar1 == kEmptyGroup + 0x10) == (pcVar2 == kEmptyGroup + 0x10)) {
      if (pcVar1 == (ctrl_t *)0x0 || pcVar2 == (ctrl_t *)0x0) goto LAB_00e6250b;
      if ((pcVar2 == kSooControl) == (pcVar1 == kSooControl)) {
        pcVar3 = (ctrl_t *)(a->field_1).slot_;
        pcVar4 = (ctrl_t *)(b->field_1).slot_;
        if (pcVar1 == kSooControl) {
          bVar6 = pcVar3 == pcVar4;
        }
        else {
          pcVar7 = pcVar4;
          pcVar5 = pcVar2;
          if (pcVar2 < pcVar1) {
            pcVar7 = pcVar3;
            pcVar5 = pcVar1;
            pcVar3 = pcVar4;
          }
          bVar6 = pcVar3 <= pcVar7 && pcVar5 < pcVar3;
        }
        if (bVar6) goto LAB_00e6250b;
      }
      goto LAB_00e62522;
    }
  }
  else {
    operator==();
LAB_00e62518:
    operator==();
  }
  operator==();
LAB_00e62522:
  operator==();
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }